

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall Expr_pi2_Test::TestBody(Expr_pi2_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr *ex;
  double in_XMM0_Qa;
  AssertHelper local_70;
  Message local_68 [3];
  string local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  ExprPtr expr;
  Expr_pi2_Test *this_local;
  
  mathiu::impl::sin((impl *)&gtest_ar.message_,in_XMM0_Qa);
  mathiu::impl::toString_abi_cxx11_(&local_50,(impl *)&gtest_ar.message_,ex);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_30,"toString(expr)","\"0\"",&local_50,(char (*) [2])0x3bae05);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x19,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Expr, pi2)
{
    auto expr = sin(pi);
    EXPECT_EQ(toString(expr), "0");
}